

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::GatherTesselationShader::~GatherTesselationShader
          (GatherTesselationShader *this)

{
  GatherTesselationShader *this_local;
  
  ~GatherTesselationShader(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 400               \n"
			   "in vec4 v_in_0;            \n"
			   "out vec4 d;                \n"
			   "void main() {              \n"
			   "   gl_Position = vec4(0, 0, 0, 1); \n"
			   "   d = v_in_0;             \n"
			   "}";
	}